

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON * phosg::JSON::parse(JSON *__return_storage_ptr__,StringReader *r,bool disable_extensions)

{
  long lVar1;
  StringReader *pSVar2;
  char __c;
  int8_t iVar3;
  bool bVar4;
  byte bVar5;
  uint8_t uVar6;
  ushort uVar7;
  int iVar8;
  parse_error *ppVar9;
  size_t sVar10;
  string *this;
  size_t sVar11;
  ulong uVar12;
  JSON *item;
  bool bVar13;
  string local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  JSON local_568;
  JSON local_528;
  JSON local_4e8;
  JSON local_4a8;
  undefined1 local_461;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  undefined1 local_419;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [3];
  out_of_range *anon_var_0_1;
  uint16_t value_1;
  out_of_range *anon_var_0;
  undefined1 local_330 [6];
  uint8_t value;
  char ch;
  string data;
  JSON local_2d0;
  int local_290;
  byte local_28b;
  int8_t local_28a;
  char local_289;
  int e;
  bool e_negative;
  char sign_char;
  char exp_specifier;
  double this_place;
  bool negative;
  double dStack_278;
  bool is_int;
  double float_data;
  int64_t int_data;
  undefined1 local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  char local_1da;
  char local_1d9;
  undefined1 local_1d8 [6];
  char separator_1;
  char expected_separator_1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>,_bool>
  *local_198;
  JSON local_188;
  undefined1 local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  JSON key;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char local_72;
  char local_71;
  undefined1 local_70 [6];
  char separator;
  char expected_separator;
  int8_t local_1b;
  undefined1 local_1a;
  byte local_19;
  char root_type_ch;
  StringReader *pSStack_18;
  bool disable_extensions_local;
  StringReader *r_local;
  JSON *ret;
  
  local_19 = disable_extensions;
  pSStack_18 = r;
  r_local = (StringReader *)__return_storage_ptr__;
  skip_whitespace_and_comments(r,disable_extensions);
  local_1a = 0;
  JSON(__return_storage_ptr__);
  local_1b = StringReader::get_s8(pSStack_18,false);
  if (local_1b == '{') {
    dict();
    operator=(__return_storage_ptr__,(JSON *)local_70);
    ~JSON((JSON *)local_70);
    local_71 = '{';
    local_72 = StringReader::get_s8(pSStack_18,true);
    while( true ) {
      if (local_72 == '}') {
        return __return_storage_ptr__;
      }
      item = (JSON *)(ulong)(uint)(int)local_71;
      if ((int)local_72 != (int)local_71) break;
      local_71 = ',';
      skip_whitespace_and_comments(pSStack_18,(bool)(local_19 & 1));
      if (((local_19 & 1) == 0) && (iVar3 = StringReader::get_s8(pSStack_18,false), iVar3 == '}')) {
        StringReader::get_s8(pSStack_18,true);
        return __return_storage_ptr__;
      }
      parse((JSON *)local_100,pSStack_18,(bool)(local_19 & 1));
      skip_whitespace_and_comments(pSStack_18,(bool)(local_19 & 1));
      iVar3 = StringReader::get_s8(pSStack_18,true);
      if (iVar3 != ':') {
        local_141 = 1;
        ppVar9 = (parse_error *)__cxa_allocate_exception(0x10);
        sVar10 = StringReader::where(pSStack_18);
        ::std::__cxx11::to_string(&local_140,sVar10);
        ::std::operator+(&local_120,"dictionary does not contain key/value pairs; pos=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_140);
        parse_error::parse_error(ppVar9,(string *)&local_120);
        local_141 = 0;
        __cxa_throw(ppVar9,&parse_error::typeinfo,parse_error::~parse_error);
      }
      skip_whitespace_and_comments(pSStack_18,(bool)(local_19 & 1));
      this = as_string_abi_cxx11_((JSON *)local_100);
      parse(&local_188,pSStack_18,(bool)(local_19 & 1));
      local_198 = emplace((pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>,_bool>
                           *)__return_storage_ptr__,(JSON *)this,(string *)&local_188,item);
      ~JSON(&local_188);
      skip_whitespace_and_comments(pSStack_18,(bool)(local_19 & 1));
      local_72 = StringReader::get_s8(pSStack_18,true);
      ~JSON((JSON *)local_100);
    }
    key.value.
    super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    .
    super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    ._63_1_ = 1;
    ppVar9 = (parse_error *)__cxa_allocate_exception(0x10);
    sVar10 = StringReader::where(pSStack_18);
    ::std::__cxx11::to_string(&local_b8,sVar10);
    ::std::operator+(&local_98,"string is not a dictionary; pos=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8)
    ;
    parse_error::parse_error(ppVar9,(string *)&local_98);
    key.value.
    super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
    .
    super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    .
    super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
    ._63_1_ = 0;
    __cxa_throw(ppVar9,&parse_error::typeinfo,parse_error::~parse_error);
  }
  if (local_1b == '[') {
    list();
    operator=(__return_storage_ptr__,(JSON *)local_1d8);
    ~JSON((JSON *)local_1d8);
    local_1d9 = '[';
    local_1da = StringReader::get_s8(pSStack_18,true);
    while( true ) {
      if (local_1da == ']') {
        return __return_storage_ptr__;
      }
      if (local_1da != local_1d9) break;
      local_1d9 = ',';
      skip_whitespace_and_comments(pSStack_18,(bool)(local_19 & 1));
      if (((local_19 & 1) == 0) && (iVar3 = StringReader::get_s8(pSStack_18,false), iVar3 == ']')) {
        StringReader::get_s8(pSStack_18,true);
        return __return_storage_ptr__;
      }
      parse((JSON *)&int_data,pSStack_18,(bool)(local_19 & 1));
      emplace_back(__return_storage_ptr__,(JSON *)&int_data);
      ~JSON((JSON *)&int_data);
      skip_whitespace_and_comments(pSStack_18,(bool)(local_19 & 1));
      local_1da = StringReader::get_s8(pSStack_18,true);
    }
    local_221 = 1;
    ppVar9 = (parse_error *)__cxa_allocate_exception(0x10);
    sVar10 = StringReader::where(pSStack_18);
    ::std::__cxx11::to_string(&local_220,sVar10);
    ::std::operator+(&local_200,"string is not a list; pos=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220
                    );
    parse_error::parse_error(ppVar9,(string *)&local_200);
    local_221 = 0;
    __cxa_throw(ppVar9,&parse_error::typeinfo,parse_error::~parse_error);
  }
  if (((local_1b != '-') && (local_1b != '+')) && (iVar8 = isdigit((int)local_1b), iVar8 == 0)) {
    if (local_1b == '\"') {
      StringReader::get_s8(pSStack_18,true);
      ::std::__cxx11::string::string((string *)local_330);
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            iVar3 = StringReader::get_s8(pSStack_18,false);
                            if (iVar3 == '\"') {
                              StringReader::get_s8(pSStack_18,true);
                              JSON(&local_4a8,(string *)local_330);
                              operator=(__return_storage_ptr__,&local_4a8);
                              ~JSON(&local_4a8);
                              ::std::__cxx11::string::~string((string *)local_330);
                              return __return_storage_ptr__;
                            }
                            anon_var_0._7_1_ = StringReader::get_s8(pSStack_18,true);
                            if (anon_var_0._7_1_ == '\\') break;
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_330,anon_var_0._7_1_);
                          }
                          anon_var_0._7_1_ = StringReader::get_s8(pSStack_18,true);
                          if (anon_var_0._7_1_ != '\"') break;
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_330,'\"');
                        }
                        if (anon_var_0._7_1_ != '\\') break;
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_330,'\\');
                      }
                      if (anon_var_0._7_1_ != '/') break;
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_330,'/');
                    }
                    if (anon_var_0._7_1_ != 'b') break;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_330,'\b');
                  }
                  if (anon_var_0._7_1_ != 'f') break;
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_330,'\f');
                }
                if (anon_var_0._7_1_ != 'n') break;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_330,'\n');
              }
              if (anon_var_0._7_1_ != 'r') break;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_330,'\r');
            }
            if (anon_var_0._7_1_ != 't') break;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330
                      ,'\t');
          }
          if (anon_var_0._7_1_ != 'x') break;
          iVar3 = StringReader::get_s8(pSStack_18,true);
          uVar6 = value_for_hex_char(iVar3);
          anon_var_0._6_1_ = uVar6 << 4;
          iVar3 = StringReader::get_s8(pSStack_18,true);
          bVar5 = value_for_hex_char(iVar3);
          anon_var_0._6_1_ = anon_var_0._6_1_ | bVar5;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                     anon_var_0._6_1_);
        }
        if (anon_var_0._7_1_ != 'u') break;
        iVar3 = StringReader::get_s8(pSStack_18,true);
        bVar5 = value_for_hex_char(iVar3);
        anon_var_0_1._4_2_ = (ushort)bVar5 << 0xc;
        iVar3 = StringReader::get_s8(pSStack_18,true);
        bVar5 = value_for_hex_char(iVar3);
        anon_var_0_1._4_2_ = anon_var_0_1._4_2_ | (ushort)bVar5 << 8;
        iVar3 = StringReader::get_s8(pSStack_18,true);
        bVar5 = value_for_hex_char(iVar3);
        anon_var_0_1._4_2_ = anon_var_0_1._4_2_ | (ushort)bVar5 << 4;
        iVar3 = StringReader::get_s8(pSStack_18,true);
        bVar5 = value_for_hex_char(iVar3);
        uVar7 = anon_var_0_1._4_2_ | bVar5;
        if ((anon_var_0_1._4_2_ & 0xff00) != 0) {
          local_419 = 1;
          anon_var_0_1._4_2_ = uVar7;
          ppVar9 = (parse_error *)__cxa_allocate_exception(0x10);
          sVar10 = StringReader::where(pSStack_18);
          ::std::__cxx11::to_string(&local_418,sVar10);
          ::std::operator+(local_3f8,"non-ascii unicode character sequence in string; pos=",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_418);
          parse_error::parse_error(ppVar9,(string *)local_3f8);
          local_419 = 0;
          __cxa_throw(ppVar9,&parse_error::typeinfo,parse_error::~parse_error);
        }
        anon_var_0_1._4_1_ = (char)uVar7;
        __c = anon_var_0_1._4_1_;
        anon_var_0_1._4_2_ = uVar7;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                   __c);
      }
      local_461 = 1;
      ppVar9 = (parse_error *)__cxa_allocate_exception(0x10);
      sVar10 = StringReader::where(pSStack_18);
      ::std::__cxx11::to_string(&local_460,sVar10);
      ::std::operator+(&local_440,"invalid escape sequence in string; pos=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_460);
      parse_error::parse_error(ppVar9,(string *)&local_440);
      local_461 = 0;
      __cxa_throw(ppVar9,&parse_error::typeinfo,parse_error::~parse_error);
    }
    bVar13 = StringReader::skip_if(pSStack_18,"null",4);
    if ((bVar13) ||
       (((local_19 & 1) == 0 && (bVar13 = StringReader::skip_if(pSStack_18,"n",1), bVar13)))) {
      JSON(&local_4e8,(nullptr_t)0x0);
      operator=(__return_storage_ptr__,&local_4e8);
      ~JSON(&local_4e8);
      return __return_storage_ptr__;
    }
    bVar13 = StringReader::skip_if(pSStack_18,"true",4);
    if ((bVar13) ||
       (((local_19 & 1) == 0 && (bVar13 = StringReader::skip_if(pSStack_18,"t",1), bVar13)))) {
      JSON(&local_528,true);
      operator=(__return_storage_ptr__,&local_528);
      ~JSON(&local_528);
      return __return_storage_ptr__;
    }
    bVar13 = StringReader::skip_if(pSStack_18,"false",5);
    if ((!bVar13) &&
       (((local_19 & 1) != 0 || (bVar13 = StringReader::skip_if(pSStack_18,"f",1), !bVar13)))) {
      ppVar9 = (parse_error *)__cxa_allocate_exception(0x10);
      sVar10 = StringReader::where(pSStack_18);
      ::std::__cxx11::to_string(&local_5a8,sVar10);
      ::std::operator+(&local_588,"unknown root sentinel; pos=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_5a8);
      parse_error::parse_error(ppVar9,(string *)&local_588);
      __cxa_throw(ppVar9,&parse_error::typeinfo,parse_error::~parse_error);
    }
    JSON(&local_568,false);
    operator=(__return_storage_ptr__,&local_568);
    ~JSON(&local_568);
    return __return_storage_ptr__;
  }
  this_place._7_1_ = 1;
  this_place._6_1_ = 0;
  if (local_1b == '-') {
    this_place._6_1_ = 1;
    StringReader::get_s8(pSStack_18,true);
  }
  if ((local_19 & 1) == 0) {
    sVar10 = StringReader::where(pSStack_18);
    sVar11 = StringReader::size(pSStack_18);
    if ((sVar10 + 2 < sVar11) &&
       (iVar3 = StringReader::get_s8(pSStack_18,false), pSVar2 = pSStack_18, iVar3 == '0')) {
      sVar10 = StringReader::where(pSStack_18);
      iVar3 = StringReader::pget_s8(pSVar2,sVar10 + 1);
      pSVar2 = pSStack_18;
      if (iVar3 == 'x') {
        StringReader::where(pSStack_18);
        StringReader::go(pSVar2);
        float_data = 0.0;
        while( true ) {
          bVar4 = StringReader::eof(pSStack_18);
          bVar13 = false;
          if (!bVar4) {
            iVar3 = StringReader::get_s8(pSStack_18,false);
            iVar8 = isxdigit((int)iVar3);
            bVar13 = iVar8 != 0;
          }
          if (!bVar13) break;
          uVar12 = (long)float_data << 4;
          iVar3 = StringReader::get_s8(pSStack_18,true);
          bVar5 = value_for_hex_char(iVar3);
          float_data = (double)(uVar12 | bVar5);
        }
        goto LAB_0011ea57;
      }
    }
  }
  float_data = 0.0;
  while( true ) {
    bVar4 = StringReader::eof(pSStack_18);
    bVar13 = false;
    if (!bVar4) {
      iVar3 = StringReader::get_s8(pSStack_18,false);
      iVar8 = isdigit((int)iVar3);
      bVar13 = iVar8 != 0;
    }
    if (!bVar13) break;
    lVar1 = (long)float_data * 10;
    iVar3 = StringReader::get_s8(pSStack_18,true);
    float_data = (double)(lVar1 + (iVar3 + -0x30));
  }
  _e = 0.1;
  dStack_278 = (double)(long)float_data;
  bVar13 = StringReader::eof(pSStack_18);
  if ((!bVar13) && (iVar3 = StringReader::get_s8(pSStack_18,false), iVar3 == '.')) {
    this_place._7_1_ = 0;
    StringReader::get_s8(pSStack_18,true);
    while( true ) {
      bVar4 = StringReader::eof(pSStack_18);
      bVar13 = false;
      if (!bVar4) {
        iVar3 = StringReader::get_s8(pSStack_18,false);
        iVar8 = isdigit((int)iVar3);
        bVar13 = iVar8 != 0;
      }
      if (!bVar13) break;
      iVar3 = StringReader::get_s8(pSStack_18,true);
      dStack_278 = (double)(iVar3 + -0x30) * _e + dStack_278;
      _e = _e * 0.1;
    }
  }
  bVar13 = StringReader::eof(pSStack_18);
  if (bVar13) {
    local_289 = '\0';
  }
  else {
    local_289 = StringReader::get_s8(pSStack_18,false);
  }
  if ((local_289 == 'e') || (local_289 == 'E')) {
    StringReader::get_s8(pSStack_18,true);
    local_28a = StringReader::get_s8(pSStack_18,false);
    local_28b = local_28a == '-';
    if ((local_28a == '-') || (local_28a == '+')) {
      StringReader::get_s8(pSStack_18,true);
    }
    local_290 = 0;
    while( true ) {
      bVar4 = StringReader::eof(pSStack_18);
      bVar13 = false;
      if (!bVar4) {
        iVar3 = StringReader::get_s8(pSStack_18,false);
        iVar8 = isdigit((int)iVar3);
        bVar13 = iVar8 != 0;
      }
      if (!bVar13) break;
      iVar8 = local_290 * 10;
      iVar3 = StringReader::get_s8(pSStack_18,true);
      local_290 = iVar8 + iVar3 + -0x30;
    }
    if ((local_28b & 1) == 0) {
      for (; 0 < local_290; local_290 = local_290 + -1) {
        float_data = (double)((long)float_data * 10);
        dStack_278 = dStack_278 * 10.0;
      }
    }
    else {
      for (; 0 < local_290; local_290 = local_290 + -1) {
        float_data = (double)(long)((double)(long)float_data * 0.1);
        dStack_278 = dStack_278 * 0.1;
      }
    }
  }
LAB_0011ea57:
  if ((this_place._6_1_ & 1) != 0) {
    float_data = (double)-(long)float_data;
    dStack_278 = -dStack_278;
  }
  if ((this_place._7_1_ & 1) == 0) {
    JSON((JSON *)((long)&data.field_2 + 8),dStack_278);
    operator=(__return_storage_ptr__,(JSON *)((long)&data.field_2 + 8));
    ~JSON((JSON *)((long)&data.field_2 + 8));
  }
  else {
    JSON(&local_2d0,(int64_t)float_data);
    operator=(__return_storage_ptr__,&local_2d0);
    ~JSON(&local_2d0);
  }
  return __return_storage_ptr__;
}

Assistant:

JSON JSON::parse(StringReader& r, bool disable_extensions) {
  skip_whitespace_and_comments(r, disable_extensions);

  JSON ret;
  char root_type_ch = r.get_s8(false);
  if (root_type_ch == '{') {
    ret = JSON::dict();
    char expected_separator = '{';
    char separator = r.get_s8();
    while (separator != '}') {
      if (separator != expected_separator) {
        throw parse_error("string is not a dictionary; pos=" + to_string(r.where()));
      }
      expected_separator = ',';

      skip_whitespace_and_comments(r, disable_extensions);
      if (!disable_extensions && (r.get_s8(false) == '}')) {
        r.get_s8();
        break;
      }

      JSON key = JSON::parse(r, disable_extensions);
      skip_whitespace_and_comments(r, disable_extensions);

      if (r.get_s8() != ':') {
        throw parse_error("dictionary does not contain key/value pairs; pos=" + to_string(r.where()));
      }
      skip_whitespace_and_comments(r, disable_extensions);

      ret.emplace(std::move(key.as_string()), JSON::parse(r, disable_extensions));
      skip_whitespace_and_comments(r, disable_extensions);
      separator = r.get_s8();
    }

  } else if (root_type_ch == '[') {
    ret = JSON::list();
    char expected_separator = '[';
    char separator = r.get_s8();
    while (separator != ']') {
      if (separator != expected_separator) {
        throw parse_error("string is not a list; pos=" + to_string(r.where()));
      }
      expected_separator = ',';

      skip_whitespace_and_comments(r, disable_extensions);
      if (!disable_extensions && (r.get_s8(false) == ']')) {
        r.get_s8();
        break;
      }

      ret.emplace_back(JSON::parse(r, disable_extensions));
      skip_whitespace_and_comments(r, disable_extensions);
      separator = r.get_s8();
    }

  } else if (root_type_ch == '-' || root_type_ch == '+' || isdigit(root_type_ch)) {
    int64_t int_data;
    double float_data;
    bool is_int = true;

    bool negative = false;
    if (root_type_ch == '-') {
      negative = true;
      r.get_s8();
    }

    if (!disable_extensions &&
        ((r.where() + 2) < r.size()) &&
        (r.get_s8(false) == '0') &&
        (r.pget_s8(r.where() + 1) == 'x')) { // hex
      r.go(r.where() + 2);

      int_data = 0;
      while (!r.eof() && isxdigit(r.get_s8(false))) {
        int_data = (int_data << 4) | value_for_hex_char(r.get_s8());
      }

    } else { // decimal
      int_data = 0;
      while (!r.eof() && isdigit(r.get_s8(false))) {
        int_data = int_data * 10 + (r.get_s8() - '0');
      }

      double this_place = 0.1;
      float_data = int_data;
      if (!r.eof() && r.get_s8(false) == '.') {
        is_int = false;
        r.get_s8();
        while (!r.eof() && isdigit(r.get_s8(false))) {
          float_data += (r.get_s8() - '0') * this_place;
          this_place *= 0.1;
        }
      }

      char exp_specifier = r.eof() ? '\0' : r.get_s8(false);
      if (exp_specifier == 'e' || exp_specifier == 'E') {
        r.get_s8();
        char sign_char = r.get_s8(false);
        bool e_negative = sign_char == '-';
        if (sign_char == '-' || sign_char == '+') {
          r.get_s8();
        }

        int e = 0;
        while (!r.eof() && isdigit(r.get_s8(false))) {
          e = e * 10 + (r.get_s8() - '0');
        }

        if (e_negative) {
          for (; e > 0; e--) {
            int_data *= 0.1;
            float_data *= 0.1;
          }
        } else {
          for (; e > 0; e--) {
            int_data *= 10;
            float_data *= 10;
          }
        }
      }
    }

    if (negative) {
      int_data = -int_data;
      float_data = -float_data;
    }

    if (is_int) {
      ret = int_data;
    } else {
      ret = float_data;
    }

  } else if (root_type_ch == '\"') {
    r.get_s8();

    string data;
    while (r.get_s8(false) != '\"') {
      char ch = r.get_s8();
      if (ch == '\\') {
        ch = r.get_s8();
        if (ch == '\"') {
          data.push_back('\"');
        } else if (ch == '\\') {
          data.push_back('\\');
        } else if (ch == '/') {
          data.push_back('/');
        } else if (ch == 'b') {
          data.push_back('\b');
        } else if (ch == 'f') {
          data.push_back('\f');
        } else if (ch == 'n') {
          data.push_back('\n');
        } else if (ch == 'r') {
          data.push_back('\r');
        } else if (ch == 't') {
          data.push_back('\t');
        } else if (ch == 'x') {
          uint8_t value;
          try {
            value = value_for_hex_char(r.get_s8()) << 4;
            value |= value_for_hex_char(r.get_s8());
          } catch (const out_of_range&) {
            throw parse_error("incomplete hex escape sequence in string; pos=" + to_string(r.where()));
          }
          data.push_back(value);
        } else if (ch == 'u') {
          uint16_t value;
          try {
            value = value_for_hex_char(r.get_s8()) << 12;
            value |= value_for_hex_char(r.get_s8()) << 8;
            value |= value_for_hex_char(r.get_s8()) << 4;
            value |= value_for_hex_char(r.get_s8());
          } catch (const out_of_range&) {
            throw parse_error("incomplete unicode escape sequence in string; pos=" + to_string(r.where()));
          }
          // TODO: we should eventually be able to support this
          if (value & 0xFF00) {
            throw parse_error("non-ascii unicode character sequence in string; pos=" + to_string(r.where()));
          }
          data.push_back(value);
        } else {
          throw parse_error("invalid escape sequence in string; pos=" + to_string(r.where()));
        }
      } else { // not an escape sequence
        data.push_back(ch);
      }
    }
    r.get_s8();

    ret = std::move(data);

  } else if (r.skip_if("null", 4) || (!disable_extensions && r.skip_if("n", 1))) {
    ret = nullptr;

  } else if (r.skip_if("true", 4) || (!disable_extensions && r.skip_if("t", 1))) {
    ret = true;

  } else if (r.skip_if("false", 5) || (!disable_extensions && r.skip_if("f", 1))) {
    ret = false;

  } else {
    throw parse_error("unknown root sentinel; pos=" + to_string(r.where()));
  }

  return ret;
}